

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  char *pcVar1;
  int in_EDI;
  size_t i;
  allocator *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  ulong local_10;
  int local_4;
  
  local_4 = in_EDI;
  for (local_10 = 0; local_10 < 6; local_10 = local_10 + 1) {
    if (local_4 == *(int *)(signalDefs + local_10 * 0x10)) {
      pcVar1 = *(char **)(signalDefs + local_10 * 0x10 + 8);
      in_stack_ffffffffffffff88 = &local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,pcVar1,in_stack_ffffffffffffff88);
      fatal(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"<unknown signal>",(allocator *)&stack0xffffffffffffff97);
  fatal(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  return;
}

Assistant:

static void handleSignal( int sig ) {
            for( std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i )
                if( sig == signalDefs[i].id )
                    fatal( signalDefs[i].name, -sig );
            fatal( "<unknown signal>", -sig );
        }